

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O2

long b_array::detach_item<long>(Array<long> *data,size_t *size)

{
  long lVar1;
  size_t sVar2;
  long *plVar3;
  
  if (*size != 0) {
    plVar3 = Array<long>::operator[](data,*size - 1);
    lVar1 = *plVar3;
    plVar3 = Array<long>::operator[](data,*size);
    *plVar3 = 0;
    sVar2 = *size;
    *size = sVar2 - 1;
    plVar3 = Array<long>::operator[](data,sVar2 - 1);
    *plVar3 = 0;
    return lVar1;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jaasonw[P]Database/include/util/array/array_util.h"
                ,0x4c,"T b_array::detach_item(b_array::Array<T> &, size_t &) [T = long]");
}

Assistant:

T detach_item(b_array::Array<T>& data, size_t& size) {
    assert(size > 0);
    T item = data[size - 1];
    data[size] = T();
    data[--size] = T();
    return item;
}